

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::AllocStackPos(SQFuncState *this)

{
  SQUnsignedInteger SVar1;
  SQFuncState *in_RDI;
  SQInteger npos;
  SQChar *in_stack_ffffffffffffff98;
  SQLocalVarInfo *val;
  sqvector<SQLocalVarInfo> *this_00;
  sqvector<SQLocalVarInfo> local_38;
  SQUnsignedInteger local_10;
  
  val = (SQLocalVarInfo *)&in_RDI->_vlocals;
  local_10 = sqvector<SQLocalVarInfo>::size((sqvector<SQLocalVarInfo> *)val);
  this_00 = &local_38;
  SQLocalVarInfo::SQLocalVarInfo((SQLocalVarInfo *)in_RDI);
  sqvector<SQLocalVarInfo>::push_back(this_00,val);
  SQLocalVarInfo::~SQLocalVarInfo((SQLocalVarInfo *)0x130ac0);
  SVar1 = sqvector<SQLocalVarInfo>::size((sqvector<SQLocalVarInfo> *)&in_RDI->_vlocals);
  if ((ulong)in_RDI->_stacksize < SVar1) {
    if (0xff < in_RDI->_stacksize) {
      Error(in_RDI,in_stack_ffffffffffffff98);
    }
    SVar1 = sqvector<SQLocalVarInfo>::size(&in_RDI->_vlocals);
    in_RDI->_stacksize = SVar1;
  }
  return local_10;
}

Assistant:

SQInteger SQFuncState::AllocStackPos()
{
    SQInteger npos=_vlocals.size();
    _vlocals.push_back(SQLocalVarInfo());
    if(_vlocals.size()>((SQUnsignedInteger)_stacksize)) {
        if(_stacksize>MAX_FUNC_STACKSIZE) Error(_SC("internal compiler error: too many locals"));
        _stacksize=_vlocals.size();
    }
    return npos;
}